

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::ReLU_x86_avx::forward_inplace(ReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  _func_int **pp_Var2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 (*pauVar11) [32];
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  Mat local_78;
  
  iVar10 = bottom_top_blob->elempack;
  if (iVar10 == 0) {
    iVar7 = bottom_top_blob->c;
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  }
  else {
    iVar7 = (int)bottom_top_blob->elemsize << 3;
    if (iVar7 / iVar10 == 8) {
      forward_inplace_int8(this,bottom_top_blob,(Option *)((long)iVar7 % (long)iVar10 & 0xffffffff))
      ;
      return 0;
    }
    iVar7 = bottom_top_blob->c;
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    if (iVar10 == 4) {
      if (*(float *)(&this->field_0xd0 + (long)this->_vptr_ReLU_x86_avx[-3]) == 0.0) {
        iVar10 = 0;
        if (iVar9 < 1) {
          iVar9 = iVar10;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        for (; iVar10 != iVar7; iVar10 = iVar10 + 1) {
          Mat::channel(&local_78,bottom_top_blob,iVar10);
          pauVar11 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          iVar8 = iVar9;
          while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
            auVar4 = vmaxps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])*pauVar11);
            *(undefined1 (*) [16])*pauVar11 = auVar4;
            pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
          }
        }
        return 0;
      }
      iVar10 = 0;
      if (iVar9 < 1) {
        iVar9 = iVar10;
      }
      if (iVar7 < 1) {
        iVar7 = iVar10;
      }
      for (; iVar10 != iVar7; iVar10 = iVar10 + 1) {
        Mat::channel(&local_78,bottom_top_blob,iVar10);
        pauVar11 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        pp_Var2 = this->_vptr_ReLU_x86_avx;
        iVar8 = iVar9;
        while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
          auVar4 = vmaxps_avx(*(undefined1 (*) [16])*pauVar11,ZEXT816(0) << 0x40);
          auVar5 = vminps_avx(*(undefined1 (*) [16])*pauVar11,ZEXT816(0) << 0x40);
          fVar1 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
          auVar13._0_4_ = fVar1 * auVar5._0_4_ + auVar4._0_4_;
          auVar13._4_4_ = fVar1 * auVar5._4_4_ + auVar4._4_4_;
          auVar13._8_4_ = fVar1 * auVar5._8_4_ + auVar4._8_4_;
          auVar13._12_4_ = fVar1 * auVar5._12_4_ + auVar4._12_4_;
          *(undefined1 (*) [16])*pauVar11 = auVar13;
          pauVar11 = (undefined1 (*) [32])(*pauVar11 + 0x10);
        }
      }
      return 0;
    }
    if (iVar10 == 8) {
      if (*(float *)(&this->field_0xd0 + (long)this->_vptr_ReLU_x86_avx[-3]) == 0.0) {
        iVar10 = 0;
        if (iVar9 < 1) {
          iVar9 = iVar10;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        for (; iVar10 != iVar7; iVar10 = iVar10 + 1) {
          Mat::channel(&local_78,bottom_top_blob,iVar10);
          pauVar11 = (undefined1 (*) [32])local_78.data;
          Mat::~Mat(&local_78);
          iVar8 = iVar9;
          while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
            auVar3 = vmaxps_avx(ZEXT1632(ZEXT816(0) << 0x40),*pauVar11);
            *pauVar11 = auVar3;
            pauVar11 = pauVar11 + 1;
          }
        }
        return 0;
      }
      iVar10 = 0;
      if (iVar9 < 1) {
        iVar9 = iVar10;
      }
      if (iVar7 < 1) {
        iVar7 = iVar10;
      }
      for (; iVar10 != iVar7; iVar10 = iVar10 + 1) {
        Mat::channel(&local_78,bottom_top_blob,iVar10);
        pauVar11 = (undefined1 (*) [32])local_78.data;
        Mat::~Mat(&local_78);
        pp_Var2 = this->_vptr_ReLU_x86_avx;
        iVar8 = iVar9;
        while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
          auVar3 = vmaxps_avx(*pauVar11,ZEXT1632(ZEXT816(0) << 0x40));
          auVar6 = vminps_avx(*pauVar11,ZEXT1632(ZEXT816(0) << 0x40));
          fVar1 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
          auVar14._0_4_ = fVar1 * auVar6._0_4_ + auVar3._0_4_;
          auVar14._4_4_ = fVar1 * auVar6._4_4_ + auVar3._4_4_;
          auVar14._8_4_ = fVar1 * auVar6._8_4_ + auVar3._8_4_;
          auVar14._12_4_ = fVar1 * auVar6._12_4_ + auVar3._12_4_;
          auVar14._16_4_ = fVar1 * auVar6._16_4_ + auVar3._16_4_;
          auVar14._20_4_ = fVar1 * auVar6._20_4_ + auVar3._20_4_;
          auVar14._24_4_ = fVar1 * auVar6._24_4_ + auVar3._24_4_;
          auVar14._28_4_ = auVar6._28_4_ + auVar3._28_4_;
          *pauVar11 = auVar14;
          pauVar11 = pauVar11 + 1;
        }
      }
      return 0;
    }
  }
  if (*(float *)(&this->field_0xd0 + (long)this->_vptr_ReLU_x86_avx[-3]) == 0.0) {
    iVar10 = 0;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    for (; iVar10 != iVar7; iVar10 = iVar10 + 1) {
      Mat::channel(&local_78,bottom_top_blob,iVar10);
      pauVar11 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      for (iVar8 = iVar9; 0 < iVar8; iVar8 = iVar8 + -1) {
        auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)*pauVar11));
        *(int *)*pauVar11 = auVar4._0_4_;
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 4);
      }
    }
  }
  else {
    iVar10 = 0;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    for (; iVar10 != iVar7; iVar10 = iVar10 + 1) {
      Mat::channel(&local_78,bottom_top_blob,iVar10);
      pauVar11 = (undefined1 (*) [32])local_78.data;
      Mat::~Mat(&local_78);
      pp_Var2 = this->_vptr_ReLU_x86_avx;
      for (iVar8 = iVar9; 0 < iVar8; iVar8 = iVar8 + -1) {
        if (*(float *)*pauVar11 < 0.0) {
          *(float *)*pauVar11 =
               *(float *)*pauVar11 * *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        }
        pauVar11 = (undefined1 (*) [32])(*pauVar11 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int ReLU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _zero = _mm256_set1_ps(0.f);
                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_max_ps(_zero, _p));
                    ptr += 8;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, lrelu_avx(_p, slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _zero = _mm_set1_ps(0.f);
                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_max_ps(_zero, _p));
                    ptr += 4;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, lrelu_sse(_p, slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *ptr = std::max(*ptr, 0.f);

                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                if (*ptr < 0)
                    *ptr *= slope;

                ptr++;
            }
        }
    }

    return 0;
}